

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLogger.cpp
# Opt level: O0

double __thiscall irr::CLogger::log(CLogger *this,double __x)

{
  long *plVar1;
  ulong uVar2;
  int in_EDX;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  SEvent event;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  if (*(int *)&(this->super_ILogger).field_0x8 <= in_EDX) {
    if (*(long *)&(this->super_ILogger).field_0x10 != 0) {
      in_stack_ffffffffffffffb0 = 9;
      plVar1 = *(long **)&(this->super_ILogger).field_0x10;
      uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,&stack0xffffffffffffffb0);
      if ((uVar2 & 1) != 0) {
        return extraout_XMM0_Qa;
      }
    }
    os::Printer::print((c8 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (ELOG_LEVEL)((ulong)this >> 0x20));
    __x = extraout_XMM0_Qa_00;
  }
  return __x;
}

Assistant:

void CLogger::log(const c8 *text, ELOG_LEVEL ll)
{
	if (ll < LogLevel)
		return;

	if (Receiver) {
		SEvent event;
		event.EventType = EET_LOG_TEXT_EVENT;
		event.LogEvent.Text = text;
		event.LogEvent.Level = ll;
		if (Receiver->OnEvent(event))
			return;
	}

	os::Printer::print(text);
}